

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

void Flush(VP8BitWriter *bw)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  
  bVar2 = (char)bw->nb_bits_ + 8;
  uVar3 = bw->value_ >> (bVar2 & 0x1f);
  bw->value_ = bw->value_ - (uVar3 << (bVar2 & 0x1f));
  bw->nb_bits_ = bw->nb_bits_ + -8;
  if ((uint8_t)uVar3 == 0xff) {
    bw->run_ = bw->run_ + 1;
  }
  else {
    sVar4 = bw->pos_;
    iVar1 = BitWriterResize(bw,(long)bw->run_ + 1);
    if (iVar1 != 0) {
      if ((sVar4 != 0 & (byte)(uVar3 >> 8)) == 1) {
        bw->buf_[sVar4 - 1] = bw->buf_[sVar4 - 1] + '\x01';
      }
      iVar1 = bw->run_;
      if (0 < iVar1) {
        while (0 < iVar1) {
          bw->buf_[sVar4] = ((uVar3 >> 8 & 1) != 0) + 0xff;
          sVar4 = sVar4 + 1;
          iVar1 = bw->run_ + -1;
          bw->run_ = iVar1;
        }
      }
      bw->buf_[sVar4] = (uint8_t)uVar3;
      bw->pos_ = sVar4 + 1;
    }
  }
  return;
}

Assistant:

static void Flush(VP8BitWriter* const bw) {
  const int s = 8 + bw->nb_bits_;
  const int32_t bits = bw->value_ >> s;
  assert(bw->nb_bits_ >= 0);
  bw->value_ -= bits << s;
  bw->nb_bits_ -= 8;
  if ((bits & 0xff) != 0xff) {
    size_t pos = bw->pos_;
    if (!BitWriterResize(bw, bw->run_ + 1)) {
      return;
    }
    if (bits & 0x100) {  // overflow -> propagate carry over pending 0xff's
      if (pos > 0) bw->buf_[pos - 1]++;
    }
    if (bw->run_ > 0) {
      const int value = (bits & 0x100) ? 0x00 : 0xff;
      for (; bw->run_ > 0; --bw->run_) bw->buf_[pos++] = value;
    }
    bw->buf_[pos++] = bits & 0xff;
    bw->pos_ = pos;
  } else {
    bw->run_++;   // delay writing of bytes 0xff, pending eventual carry.
  }
}